

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_tt_FindGlyphIndex(nk_tt_fontinfo *info,int unicode_codepoint)

{
  uchar *puVar1;
  nk_uint nVar2;
  ushort uVar3;
  nk_uint nVar4;
  nk_uint nVar5;
  nk_uint nVar6;
  ulong uVar7;
  long lVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  nk_byte *p;
  uint uVar17;
  bool bVar18;
  
  puVar1 = info->data;
  uVar10 = info->index_map;
  uVar7 = (ulong)uVar10;
  uVar3 = *(ushort *)(puVar1 + uVar7) << 8;
  uVar12 = *(ushort *)(puVar1 + uVar7) >> 8;
  uVar9 = uVar3 | uVar12;
  switch(uVar9) {
  case 0:
    if (unicode_codepoint <
        (int)((ushort)(*(ushort *)(puVar1 + uVar7 + 2) << 8 | *(ushort *)(puVar1 + uVar7 + 2) >> 8)
             - 6)) {
      return (uint)puVar1[(long)unicode_codepoint + uVar7 + 6];
    }
    break;
  default:
    if ((uVar3 | uVar12 & 0xfffe) != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x2ba4,"int nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *, int)");
    }
    nVar4 = nk_ttULONG(puVar1 + uVar7 + 0xc);
    iVar16 = 0;
    while (nVar2 = nVar4, nVar2 - iVar16 != 0 && iVar16 <= (int)nVar2) {
      nVar4 = ((int)(nVar2 - iVar16) >> 1) + iVar16;
      p = puVar1 + (long)(int)(nVar4 * 0xc) + uVar7 + 0x10;
      nVar5 = nk_ttULONG(p);
      if (nVar5 <= (uint)unicode_codepoint) {
        nVar6 = nk_ttULONG(p + 4);
        if ((uint)unicode_codepoint <= nVar6) {
          nVar4 = nk_ttULONG(p + 8);
          iVar16 = 0;
          if (uVar9 == 0xc) {
            iVar16 = unicode_codepoint - nVar5;
          }
          return iVar16 + nVar4;
        }
        iVar16 = nVar4 + 1;
        nVar4 = nVar2;
      }
    }
    break;
  case 2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x2b5d,"int nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *, int)");
  case 4:
    if (unicode_codepoint < 0x10000) {
      uVar3 = *(ushort *)(puVar1 + uVar7 + 6) << 8 | *(ushort *)(puVar1 + uVar7 + 6) >> 8;
      uVar12 = *(ushort *)(puVar1 + uVar7 + 10) << 8 | *(ushort *)(puVar1 + uVar7 + 10) >> 8;
      uVar13 = (uint)(ushort)(*(ushort *)(puVar1 + uVar7 + 8) << 8 |
                             *(ushort *)(puVar1 + uVar7 + 8) >> 8);
      uVar15 = (ulong)(puVar1[uVar7 + 0xd] & 0xfffffffe) | (ulong)puVar1[uVar7 + 0xc] << 8;
      if (unicode_codepoint <
          (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar15 + (uVar10 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar15 + (uVar10 + 0xe)) >> 8)) {
        uVar15 = 0;
      }
      uVar17 = uVar10 + (int)uVar15 + 0xc;
      while (bVar18 = uVar12 != 0, uVar12 = uVar12 - 1, bVar18) {
        uVar13 = uVar13 >> 1;
        uVar14 = uVar13 & 0xfffffffe;
        if (unicode_codepoint <=
            (int)(uint)(ushort)(*(ushort *)(puVar1 + (ulong)uVar14 + (ulong)uVar17) << 8 |
                               *(ushort *)(puVar1 + (ulong)uVar14 + (ulong)uVar17) >> 8)) {
          uVar14 = 0;
        }
        uVar17 = uVar14 + uVar17;
      }
      uVar15 = (ulong)((uVar17 - uVar10) + 0x1fff4 & 0x1fffe);
      if (unicode_codepoint <=
          (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar15 + (uVar10 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar15 + (uVar10 + 0xe)) >> 8)) {
        uVar10 = 0;
        uVar13 = (uint)(ushort)(*(ushort *)(puVar1 + uVar15 + (uVar3 & 0xfffffffe) + uVar7 + 0x10)
                                << 8 | *(ushort *)
                                        (puVar1 + uVar15 + (uVar3 & 0xfffffffe) + uVar7 + 0x10) >> 8
                               );
        if ((int)uVar13 <= unicode_codepoint) {
          uVar11 = (ulong)(uVar3 >> 1);
          lVar8 = uVar11 * 6;
          uVar3 = *(ushort *)(puVar1 + uVar15 + 2 + lVar8 + uVar7 + 0xe) << 8 |
                  *(ushort *)(puVar1 + uVar15 + 2 + lVar8 + uVar7 + 0xe) >> 8;
          if (uVar3 == 0) {
            uVar10 = (uint)(ushort)(*(ushort *)(puVar1 + uVar15 + 2 + uVar11 * 4 + uVar7 + 0xe) << 8
                                   | *(ushort *)(puVar1 + uVar15 + 2 + uVar11 * 4 + uVar7 + 0xe) >>
                                     8) + unicode_codepoint;
          }
          else {
            uVar10 = (uint)(ushort)(*(ushort *)
                                     (puVar1 + uVar15 + 0x10 +
                                               uVar7 + lVar8 +
                                               (long)(int)((unicode_codepoint - uVar13) * 2) +
                                               (ulong)uVar3) << 8 |
                                   *(ushort *)
                                    (puVar1 + uVar15 + 0x10 +
                                              uVar7 + lVar8 +
                                              (long)(int)((unicode_codepoint - uVar13) * 2) +
                                              (ulong)uVar3) >> 8);
          }
        }
        return uVar10 & 0xffff;
      }
      __assert_fail("unicode_codepoint <= nk_ttUSHORT(data + endCount + 2*item)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x2b81,"int nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *, int)");
    }
    break;
  case 6:
    uVar3 = *(ushort *)(puVar1 + uVar7 + 6) << 8 | *(ushort *)(puVar1 + uVar7 + 6) >> 8;
    if ((uint)unicode_codepoint < (uint)uVar3) {
      return 0;
    }
    if ((uint)(ushort)(*(ushort *)(puVar1 + uVar7 + 8) << 8 | *(ushort *)(puVar1 + uVar7 + 8) >> 8)
        + (uint)uVar3 <= (uint)unicode_codepoint) {
      return 0;
    }
    return (uint)(ushort)(*(ushort *)
                           (puVar1 + (long)(int)(unicode_codepoint - (uint)uVar3) * 2 + uVar7 + 10)
                          << 8 | *(ushort *)
                                  (puVar1 + (long)(int)(unicode_codepoint - (uint)uVar3) * 2 +
                                            uVar7 + 10) >> 8);
  }
  return 0;
}

Assistant:

NK_INTERN int
nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *info, int unicode_codepoint)
{
    const nk_byte *data = info->data;
    nk_uint index_map = (nk_uint)info->index_map;

    nk_ushort format = nk_ttUSHORT(data + index_map + 0);
    if (format == 0) { /* apple byte encoding */
        nk_int bytes = nk_ttUSHORT(data + index_map + 2);
        if (unicode_codepoint < bytes-6)
            return nk_ttBYTE(data + index_map + 6 + unicode_codepoint);
        return 0;
    } else if (format == 6) {
        nk_uint first = nk_ttUSHORT(data + index_map + 6);
        nk_uint count = nk_ttUSHORT(data + index_map + 8);
        if ((nk_uint) unicode_codepoint >= first && (nk_uint) unicode_codepoint < first+count)
            return nk_ttUSHORT(data + index_map + 10 + (unicode_codepoint - (int)first)*2);
        return 0;
    } else if (format == 2) {
        NK_ASSERT(0); /* @TODO: high-byte mapping for japanese/chinese/korean */
        return 0;
    } else if (format == 4) { /* standard mapping for windows fonts: binary search collection of ranges */
        nk_ushort segcount = nk_ttUSHORT(data+index_map+6) >> 1;
        nk_ushort searchRange = nk_ttUSHORT(data+index_map+8) >> 1;
        nk_ushort entrySelector = nk_ttUSHORT(data+index_map+10);
        nk_ushort rangeShift = nk_ttUSHORT(data+index_map+12) >> 1;

        /* do a binary search of the segments */
        nk_uint endCount = index_map + 14;
        nk_uint search = endCount;

        if (unicode_codepoint > 0xffff)
            return 0;

        /* they lie from endCount .. endCount + segCount */
        /* but searchRange is the nearest power of two, so... */
        if (unicode_codepoint >= nk_ttUSHORT(data + search + rangeShift*2))
            search += (nk_uint)(rangeShift*2);

        /* now decrement to bias correctly to find smallest */
        search -= 2;
        while (entrySelector) {
            nk_ushort end;
            searchRange >>= 1;
            end = nk_ttUSHORT(data + search + searchRange*2);
            if (unicode_codepoint > end)
                search += (nk_uint)(searchRange*2);
            --entrySelector;
        }
        search += 2;

      {
         nk_ushort offset, start;
         nk_ushort item = (nk_ushort) ((search - endCount) >> 1);

         NK_ASSERT(unicode_codepoint <= nk_ttUSHORT(data + endCount + 2*item));
         start = nk_ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = nk_ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (nk_ushort) (unicode_codepoint + nk_ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return nk_ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
        nk_uint ngroups = nk_ttULONG(data+index_map+12);
        nk_int low,high;
        low = 0; high = (nk_int)ngroups;
        /* Binary search the right group. */
        while (low < high) {
            nk_int mid = low + ((high-low) >> 1); /* rounds down, so low <= mid < high */
            nk_uint start_char = nk_ttULONG(data+index_map+16+mid*12);
            nk_uint end_char = nk_ttULONG(data+index_map+16+mid*12+4);
            if ((nk_uint) unicode_codepoint < start_char)
                high = mid;
            else if ((nk_uint) unicode_codepoint > end_char)
                low = mid+1;
            else {
                nk_uint start_glyph = nk_ttULONG(data+index_map+16+mid*12+8);
                if (format == 12)
                    return (int)start_glyph + (int)unicode_codepoint - (int)start_char;
                else /* format == 13 */
                    return (int)start_glyph;
            }
        }
        return 0; /* not found */
    }
    /* @TODO */
    NK_ASSERT(0);
    return 0;
}